

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestSingle_IsInfinite(void)

{
  bool in_CL;
  
  CheckHelper((char *)0xcf,0xc1c8fd,(char *)0x1,in_CL);
  CheckHelper((char *)0xd0,0xc1c925,(char *)0x1,in_CL);
  CheckHelper((char *)0xd1,0xc1c94e,(char *)0x1,in_CL);
  CheckHelper((char *)0xd2,0xc1c972,(char *)0x1,in_CL);
  CheckHelper((char *)0xd3,0xc1c98d,(char *)0x1,in_CL);
  CheckHelper((char *)0xd4,0xc1c9a9,(char *)0x1,in_CL);
  CheckHelper((char *)0xd5,0xc1c9c4,(char *)0x1,in_CL);
  CheckHelper((char *)0xd7,0xc1c9e0,(char *)0x1,in_CL);
  return;
}

Assistant:

TEST(Single_IsInfinite) {
  CHECK(Single(Single::Infinity()).IsInfinite());
  CHECK(Single(-Single::Infinity()).IsInfinite());
  CHECK(!Single(Single::NaN()).IsInfinite());
  CHECK(!Single(0.0f).IsInfinite());
  CHECK(!Single(-0.0f).IsInfinite());
  CHECK(!Single(1.0f).IsInfinite());
  CHECK(!Single(-1.0f).IsInfinite());
  uint32_t min_float32 = 0x00000001;
  CHECK(!Single(min_float32).IsInfinite());
}